

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O1

void __thiscall catalog::print(catalog *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  long *plVar3;
  TableInfo *pTVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  long lVar9;
  
  if (0 < this->tableNumber) {
    lVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tableName : ",0xc);
      pTVar4 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar9];
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(pTVar4->tableName)._M_dataplus._M_p,
                 (pTVar4->tableName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tattributeNum : ",0x10);
      plVar3 = (long *)std::ostream::operator<<
                                 (&std::cout,
                                  (this->TableInfoList).
                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar9]->attributeNum);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      pTVar4 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar9];
      if (0 < pTVar4->attributeNum) {
        lVar8 = 0;
        do {
          lVar1 = *(long *)&(pTVar4->attributeName).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,*(char **)(lVar1 + lVar8 * 0x20),
                              *(long *)(lVar1 + 8 + lVar8 * 0x20));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,*(int *)(*(long *)&((this->TableInfoList).
                                                                                                                  
                                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar9]->
                                                  type).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + lVar8 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          std::ostream::operator<<
                    (poVar5,*(int *)(*(long *)&((this->TableInfoList).
                                                super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start[lVar9]->
                                               constraint).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data + lVar8 * 4));
          if (*(int *)(*(long *)&((this->TableInfoList).
                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar9]->constraint).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + lVar8 * 4) == 3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\tprimary key ",0xd);
          }
          if (*(int *)(*(long *)&((this->TableInfoList).
                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar9]->constraint).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + lVar8 * 4) == 4) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tindex ",7);
            pTVar4 = (this->TableInfoList).
                     super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
            p_Var6 = (_Base_ptr)((long)&(pTVar4->indexInfo)._M_t._M_impl + 8);
            p_Var7 = p_Var6;
            for (p_Var2 = *(_Base_ptr *)((long)&(pTVar4->indexInfo)._M_t._M_impl + 0x10);
                p_Var2 != (_Base_ptr)0x0;
                p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < lVar8]) {
              if (lVar8 <= (int)p_Var2[1]._M_color) {
                p_Var7 = p_Var2;
              }
            }
            if ((p_Var7 != p_Var6) && ((int)p_Var7[1]._M_color <= lVar8)) {
              p_Var6 = p_Var7;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)p_Var6[1]._M_parent,(long)p_Var6[1]._M_left);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          lVar8 = lVar8 + 1;
          pTVar4 = (this->TableInfoList).
                   super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
        } while (lVar8 < pTVar4->attributeNum);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->tableNumber);
  }
  return;
}

Assistant:

void catalog::print(){
    for(int i = 0 ; i < tableNumber ; i ++){
        std::cout<<"tableName : "<<TableInfoList[i]->tableName;
        std::cout<<"\tattributeNum : "<<TableInfoList[i]->attributeNum<<std::endl;
        for(int j = 0 ; j < TableInfoList[i]->attributeNum; j ++){
            std::cout<<TableInfoList[i]->attributeName[j] << "\t"<<TableInfoList[i]->type[j] << "\t"<<TableInfoList[i]->constraint[j];
            if(TableInfoList[i]->constraint[j] == 3)std::cout<<"\tprimary key ";
            if(TableInfoList[i]->constraint[j] == 4)std::cout<<"\tindex "<<TableInfoList[i]->indexInfo.find(j)->second;
            std::cout<<"\n";
        }
        //std::cout <<"file_offset :"<<file_offset[i]<<std::endl;
    }
}